

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O1

void color_sycc_to_rgb(opj_image_t *img)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  opj_image_comp_t *poVar4;
  OPJ_INT32 *pOVar5;
  OPJ_INT32 *pOVar6;
  OPJ_INT32 *pOVar7;
  OPJ_INT32 *pOVar8;
  OPJ_INT32 *pOVar9;
  OPJ_INT32 *pOVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  double dVar18;
  double dVar19;
  
  if (img->numcomps < 3) {
    img->color_space = OPJ_CLRSPC_GRAY;
  }
  else {
    poVar4 = img->comps;
    if (poVar4->dx == 1) {
      if ((((poVar4[1].dx == 2) && (poVar4[2].dx == 2)) && (poVar4->dy == 1)) &&
         ((poVar4[1].dy == 2 && (poVar4[2].dy == 2)))) {
        sycc420_to_rgb(img);
        return;
      }
      if (((poVar4[1].dx == 2) && (poVar4[2].dx == 2)) &&
         ((poVar4->dy == 1 && ((poVar4[1].dy == 1 && (poVar4[2].dy == 1)))))) {
        sycc422_to_rgb(img);
        return;
      }
      if ((((poVar4[1].dx == 1) && (poVar4[2].dx == 1)) && (poVar4->dy == 1)) &&
         ((poVar4[1].dy == 1 && (poVar4[2].dy == 1)))) {
        bVar1 = (byte)poVar4->prec;
        iVar13 = 1 << (bVar1 - 1 & 0x1f);
        lVar12 = (ulong)poVar4->h * (ulong)poVar4->w;
        pOVar5 = poVar4->data;
        pOVar6 = poVar4[1].data;
        pOVar7 = poVar4[2].data;
        lVar11 = lVar12 * 4;
        pOVar8 = (OPJ_INT32 *)opj_image_data_alloc(lVar11);
        pOVar9 = (OPJ_INT32 *)opj_image_data_alloc(lVar11);
        pOVar10 = (OPJ_INT32 *)opj_image_data_alloc(lVar11);
        if (pOVar10 != (OPJ_INT32 *)0x0 &&
            (pOVar9 != (OPJ_INT32 *)0x0 && pOVar8 != (OPJ_INT32 *)0x0)) {
          if (lVar12 != 0) {
            uVar17 = ~(-1 << (bVar1 & 0x1f));
            lVar11 = 0;
            do {
              dVar18 = (double)(pOVar7[lVar11] - iVar13);
              iVar2 = pOVar5[lVar11];
              uVar14 = (int)(dVar18 * 1.402) + iVar2;
              uVar15 = uVar14;
              if ((int)uVar17 <= (int)uVar14) {
                uVar15 = uVar17;
              }
              uVar16 = 0;
              if (-1 < (int)uVar14) {
                uVar16 = uVar15;
              }
              iVar3 = pOVar6[lVar11];
              pOVar8[lVar11] = uVar16;
              dVar19 = (double)(iVar3 - iVar13);
              uVar14 = iVar2 - (int)(dVar19 * 0.344 + dVar18 * 0.714);
              uVar15 = uVar14;
              if ((int)uVar17 <= (int)uVar14) {
                uVar15 = uVar17;
              }
              uVar16 = 0;
              if (-1 < (int)uVar14) {
                uVar16 = uVar15;
              }
              pOVar9[lVar11] = uVar16;
              uVar14 = iVar2 + (int)(dVar19 * 1.772);
              uVar15 = uVar14;
              if ((int)uVar17 <= (int)uVar14) {
                uVar15 = uVar17;
              }
              uVar16 = 0;
              if (-1 < (int)uVar14) {
                uVar16 = uVar15;
              }
              pOVar10[lVar11] = uVar16;
              lVar11 = lVar11 + 1;
            } while (lVar12 - lVar11 != 0);
          }
          opj_image_data_free(img->comps->data);
          poVar4 = img->comps;
          poVar4->data = pOVar8;
          opj_image_data_free(poVar4[1].data);
          poVar4 = img->comps;
          poVar4[1].data = pOVar9;
          opj_image_data_free(poVar4[2].data);
          img->comps[2].data = pOVar10;
          img->color_space = OPJ_CLRSPC_SRGB;
          return;
        }
        opj_image_data_free(pOVar8);
        opj_image_data_free(pOVar9);
        opj_image_data_free(pOVar10);
        return;
      }
    }
    color_sycc_to_rgb_cold_1();
  }
  return;
}

Assistant:

void color_sycc_to_rgb(opj_image_t *img)
{
    if (img->numcomps < 3) {
        img->color_space = OPJ_CLRSPC_GRAY;
        return;
    }

    if ((img->comps[0].dx == 1)
            && (img->comps[1].dx == 2)
            && (img->comps[2].dx == 2)
            && (img->comps[0].dy == 1)
            && (img->comps[1].dy == 2)
            && (img->comps[2].dy == 2)) { /* horizontal and vertical sub-sample */
        sycc420_to_rgb(img);
    } else if ((img->comps[0].dx == 1)
               && (img->comps[1].dx == 2)
               && (img->comps[2].dx == 2)
               && (img->comps[0].dy == 1)
               && (img->comps[1].dy == 1)
               && (img->comps[2].dy == 1)) { /* horizontal sub-sample only */
        sycc422_to_rgb(img);
    } else if ((img->comps[0].dx == 1)
               && (img->comps[1].dx == 1)
               && (img->comps[2].dx == 1)
               && (img->comps[0].dy == 1)
               && (img->comps[1].dy == 1)
               && (img->comps[2].dy == 1)) { /* no sub-sample */
        sycc444_to_rgb(img);
    } else {
        fprintf(stderr, "%s:%d:color_sycc_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,
                __LINE__);
        return;
    }
}